

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_fp16_to_fp8
          (Impl *this,SPIRVModule *module,Id *ids,uint32_t id_count)

{
  uint returnType;
  Id pointee;
  initializer_list<unsigned_int> __l;
  bool bVar1;
  Id IVar2;
  Function *pFVar3;
  Block *pBVar4;
  Instruction *pIVar5;
  size_t sVar6;
  value_type local_228;
  Instruction *local_218;
  Instruction *loaded_result;
  Instruction *cmp;
  Instruction *store;
  Instruction *output_chain;
  Instruction *with_sign;
  Instruction *e4m3;
  Instruction *add_rounding;
  Instruction *rounding;
  Instruction *should_round;
  Instruction *or_rounding_bits;
  Instruction *is_odd;
  Instruction *unsigned_e5m3;
  Instruction *rounding_bits_or;
  Instruction *rounding_bits;
  Instruction *split;
  Instruction *denorm_shift;
  Instruction *trunc;
  Instruction *pre_denorm_rounding_bits;
  Instruction *mask_1;
  Instruction *mask;
  Instruction *clear_exponent_mask;
  Instruction *clear_exponent_neg_mask;
  Instruction *denorm_mask;
  Instruction *denorm_shamt;
  Instruction *exponent_minus1;
  Instruction *exponent;
  Instruction *shift_exponent;
  Instruction *unsigned_e5m11;
  Instruction *sign_bit;
  Instruction *extract_upper;
  Instruction *split_input;
  Instruction *bitcast;
  Instruction *clamp;
  Instruction *pIStack_108;
  Id glsl450;
  Instruction *load;
  Instruction *input_chain;
  Instruction *iter;
  Instruction *phi;
  Block *merge;
  Block *header;
  Instruction *len;
  undefined1 local_c8 [4];
  Id output_id;
  allocator_type local_ad;
  Id local_ac;
  iterator local_a8;
  undefined8 local_a0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_98;
  Function *local_80;
  Function *func;
  Id f16_ptr_type;
  Id s16_type;
  Id bool_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  CoopMatConvOp *ops;
  iterator __end1;
  iterator __begin1;
  Vector<CoopMatConvOp> *__range1;
  Id f16_type;
  Id u8_type;
  uint32_t id_count_local;
  Id *ids_local;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (id_count == 2) {
    returnType = *ids;
    pointee = ids[1];
    __end1 = std::
             vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
             ::begin(&this->coop_mat_conv_ids);
    ops = (CoopMatConvOp *)
          std::
          vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
          ::end(&this->coop_mat_conv_ids);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
                                       *)&ops), bVar1) {
      current_build_point =
           (Block *)__gnu_cxx::
                    __normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
                    ::operator*(&__end1);
      if (((*(Id *)((long)&current_build_point->_vptr_Block + 4) == returnType) &&
          (*(Id *)&current_build_point->_vptr_Block == pointee)) &&
         (*(HelperCall *)
           ((long)&(current_build_point->instructions).
                   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4) == CoopMatFP16toFP8)) {
        return *(Id *)&(current_build_point->instructions).
                       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
      ::operator++(&__end1);
    }
    entry = spv::Builder::getBuildPoint(&this->builder);
    _bool_type = (Block *)0x0;
    s16_type = spv::Builder::makeUintType(&this->builder,0x20);
    f16_ptr_type = spv::Builder::makeBoolType(&this->builder);
    func._4_4_ = spv::Builder::makeIntType(&this->builder,0x10);
    local_ac = spv::Builder::makePointer(&this->builder,StorageClassFunction,pointee);
    local_a8 = &local_ac;
    local_a0 = 1;
    __l._M_len = 1;
    __l._M_array = local_a8;
    func._0_4_ = local_ac;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_98,__l,&local_ad);
    memset(local_c8,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)local_c8);
    pFVar3 = spv::Builder::makeFunctionEntry
                       (&this->builder,DecorationMax,returnType,"CoopMatFP16toFP8",&local_98,
                        (Vector<dxil_spv::Vector<Decoration>_> *)local_c8,(Block **)&bool_type);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)local_c8);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_98);
    local_80 = pFVar3;
    len._4_4_ = create_variable(this,StorageClassFunction,returnType,"coop_output");
    header = (Block *)spv::Builder::addInstruction
                                (&this->builder,s16_type,OpCooperativeMatrixLengthKHR);
    sVar6 = (size_t)returnType;
    spv::Instruction::addIdOperand((Instruction *)header,returnType);
    pBVar4 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar6 = (size_t)IVar2;
    spv::Block::Block(pBVar4,IVar2,local_80);
    merge = pBVar4;
    pBVar4 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(pBVar4,IVar2,local_80);
    phi = (Instruction *)pBVar4;
    spv::Builder::createBranch(&this->builder,merge);
    spv::Builder::setBuildPoint(&this->builder,merge);
    iter = spv::Builder::addInstruction(&this->builder,s16_type,OpPhi);
    pIVar5 = spv::Builder::addInstruction(&this->builder,s16_type,OpIAdd);
    input_chain = pIVar5;
    IVar2 = spv::Instruction::getResultId(iter);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = input_chain;
    IVar2 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Block::getId(_bool_type);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Instruction::getResultId(input_chain);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Block::getId(merge);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeFloatType(&this->builder,0x10);
    IVar2 = spv::Builder::makePointer(&this->builder,StorageClassFunction,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpInBoundsAccessChain);
    load = pIVar5;
    IVar2 = spv::Function::getParamId(local_80,0);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = load;
    IVar2 = spv::Instruction::getResultId(iter);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeFloatType(&this->builder,0x10);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpLoad);
    pIStack_108 = pIVar5;
    IVar2 = spv::Instruction::getResultId(load);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    clamp._4_4_ = spv::Builder::import(&this->builder,"GLSL.std.450");
    IVar2 = spv::Builder::makeFloatType(&this->builder,0x10);
    bitcast = spv::Builder::addInstruction(&this->builder,IVar2,OpExtInst);
    spv::Instruction::addIdOperand(bitcast,clamp._4_4_);
    spv::Instruction::addImmediateOperand(bitcast,0x51);
    pIVar5 = bitcast;
    IVar2 = spv::Instruction::getResultId(pIStack_108);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = bitcast;
    IVar2 = spv::Builder::makeFloat16Constant(&this->builder,0xdf00,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = bitcast;
    IVar2 = spv::Builder::makeFloat16Constant(&this->builder,0x5f00,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpBitcast);
    split_input = pIVar5;
    IVar2 = spv::Instruction::getResultId(bitcast);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    IVar2 = spv::Builder::makeVectorType(&this->builder,IVar2,2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitcast);
    extract_upper = pIVar5;
    IVar2 = spv::Instruction::getResultId(split_input);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpCompositeExtract);
    sign_bit = pIVar5;
    IVar2 = spv::Instruction::getResultId(extract_upper);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    spv::Instruction::addImmediateOperand(sign_bit,1);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitwiseAnd);
    unsigned_e5m11 = pIVar5;
    IVar2 = spv::Instruction::getResultId(sign_bit);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = unsigned_e5m11;
    IVar2 = spv::Builder::makeUint8Constant(&this->builder,0x80,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpShiftLeftLogical);
    shift_exponent = pIVar5;
    IVar2 = spv::Instruction::getResultId(split_input);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = shift_exponent;
    IVar2 = spv::Builder::makeUint16Constant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpISub);
    exponent = pIVar5;
    IVar2 = spv::Instruction::getResultId(shift_exponent);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = exponent;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,0x4000,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    shift_exponent = exponent;
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpShiftRightArithmetic);
    exponent_minus1 = pIVar5;
    IVar2 = spv::Instruction::getResultId(exponent);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = exponent_minus1;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,0xb,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpISub);
    denorm_shamt = pIVar5;
    IVar2 = spv::Instruction::getResultId(exponent_minus1);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = denorm_shamt;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpSNegate);
    denorm_mask = pIVar5;
    IVar2 = spv::Instruction::getResultId(denorm_shamt);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    bitcast = spv::Builder::addInstruction(&this->builder,func._4_4_,OpExtInst);
    spv::Instruction::addIdOperand(bitcast,clamp._4_4_);
    spv::Instruction::addImmediateOperand(bitcast,0x2a);
    pIVar5 = bitcast;
    IVar2 = spv::Instruction::getResultId(denorm_mask);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = bitcast;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    denorm_mask = bitcast;
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpBitwiseAnd);
    clear_exponent_neg_mask = pIVar5;
    IVar2 = spv::Instruction::getResultId(denorm_shamt);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = clear_exponent_neg_mask;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,0x800,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpBitwiseAnd);
    clear_exponent_mask = pIVar5;
    IVar2 = spv::Instruction::getResultId(denorm_shamt);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = clear_exponent_mask;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,-0x800,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpBitwiseXor);
    mask = pIVar5;
    IVar2 = spv::Instruction::getResultId(clear_exponent_mask);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = mask;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,-1,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpBitwiseAnd);
    mask_1 = pIVar5;
    IVar2 = spv::Instruction::getResultId(shift_exponent);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = mask_1;
    IVar2 = spv::Instruction::getResultId(mask);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    shift_exponent = mask_1;
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpBitwiseOr);
    pre_denorm_rounding_bits = pIVar5;
    IVar2 = spv::Instruction::getResultId(shift_exponent);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = pre_denorm_rounding_bits;
    IVar2 = spv::Instruction::getResultId(clear_exponent_neg_mask);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    shift_exponent = pre_denorm_rounding_bits;
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpBitwiseAnd);
    trunc = pIVar5;
    IVar2 = spv::Instruction::getResultId(shift_exponent);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = trunc;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,0x7f,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeIntType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpSConvert);
    denorm_shift = pIVar5;
    IVar2 = spv::Instruction::getResultId(trunc);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    trunc = denorm_shift;
    pIVar5 = spv::Builder::addInstruction(&this->builder,func._4_4_,OpShiftRightArithmetic);
    split = pIVar5;
    IVar2 = spv::Instruction::getResultId(shift_exponent);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = split;
    IVar2 = spv::Instruction::getResultId(denorm_mask);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    shift_exponent = split;
    IVar2 = spv::Builder::makeIntType(&this->builder,8);
    IVar2 = spv::Builder::makeVectorType(&this->builder,IVar2,2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitcast);
    rounding_bits = pIVar5;
    IVar2 = spv::Instruction::getResultId(shift_exponent);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeIntType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpCompositeExtract);
    rounding_bits_or = pIVar5;
    IVar2 = spv::Instruction::getResultId(rounding_bits);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    spv::Instruction::addImmediateOperand(rounding_bits_or,0);
    IVar2 = spv::Builder::makeIntType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitwiseOr);
    unsigned_e5m3 = pIVar5;
    IVar2 = spv::Instruction::getResultId(rounding_bits_or);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = unsigned_e5m3;
    IVar2 = spv::Instruction::getResultId(trunc);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    rounding_bits_or = unsigned_e5m3;
    IVar2 = spv::Builder::makeIntType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpCompositeExtract);
    is_odd = pIVar5;
    IVar2 = spv::Instruction::getResultId(rounding_bits);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    spv::Instruction::addImmediateOperand(is_odd,1);
    IVar2 = spv::Builder::makeIntType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitwiseAnd);
    or_rounding_bits = pIVar5;
    IVar2 = spv::Instruction::getResultId(is_odd);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = or_rounding_bits;
    IVar2 = spv::Builder::makeInt8Constant(&this->builder,'\x01',false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeIntType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitwiseOr);
    should_round = pIVar5;
    IVar2 = spv::Instruction::getResultId(or_rounding_bits);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = should_round;
    IVar2 = spv::Instruction::getResultId(rounding_bits_or);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,f16_ptr_type,OpUGreaterThan);
    rounding = pIVar5;
    IVar2 = spv::Instruction::getResultId(should_round);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = rounding;
    IVar2 = spv::Builder::makeUint8Constant(&this->builder,0x80,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpSelect);
    add_rounding = pIVar5;
    IVar2 = spv::Instruction::getResultId(rounding);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = add_rounding;
    IVar2 = spv::Builder::makeUint8Constant(&this->builder,'\x01',false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = add_rounding;
    IVar2 = spv::Builder::makeUint8Constant(&this->builder,'\0',false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpIAdd);
    e4m3 = pIVar5;
    IVar2 = spv::Instruction::getResultId(is_odd);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = e4m3;
    IVar2 = spv::Instruction::getResultId(add_rounding);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitwiseAnd);
    with_sign = pIVar5;
    IVar2 = spv::Instruction::getResultId(e4m3);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = with_sign;
    IVar2 = spv::Builder::makeUint8Constant(&this->builder,'\x7f',false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitwiseOr);
    output_chain = pIVar5;
    IVar2 = spv::Instruction::getResultId(with_sign);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = output_chain;
    IVar2 = spv::Instruction::getResultId(unsigned_e5m11);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    IVar2 = spv::Builder::makePointer(&this->builder,StorageClassFunction,IVar2);
    store = spv::Builder::addInstruction(&this->builder,IVar2,OpInBoundsAccessChain);
    spv::Instruction::addIdOperand(store,len._4_4_);
    pIVar5 = store;
    IVar2 = spv::Instruction::getResultId(iter);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,OpStore);
    cmp = pIVar5;
    IVar2 = spv::Instruction::getResultId(store);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = cmp;
    IVar2 = spv::Instruction::getResultId(output_chain);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,f16_ptr_type,OpULessThan);
    loaded_result = pIVar5;
    IVar2 = spv::Instruction::getResultId(input_chain);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = loaded_result;
    IVar2 = spv::Instruction::getResultId((Instruction *)header);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    spv::Builder::createLoopMerge(&this->builder,(Block *)phi,merge,0);
    IVar2 = spv::Instruction::getResultId(loaded_result);
    spv::Builder::createConditionalBranch(&this->builder,IVar2,merge,(Block *)phi);
    spv::Builder::setBuildPoint(&this->builder,(Block *)phi);
    local_218 = spv::Builder::addInstruction(&this->builder,returnType,OpLoad);
    spv::Instruction::addIdOperand(local_218,len._4_4_);
    IVar2 = spv::Instruction::getResultId(local_218);
    spv::Builder::makeReturn(&this->builder,false,IVar2);
    spv::Builder::setBuildPoint(&this->builder,entry);
    local_228.input_type = pointee;
    local_228.output_type = returnType;
    local_228.func_id = spv::Function::getId(local_80);
    local_228.call = CoopMatFP16toFP8;
    std::
    vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
    ::push_back(&this->coop_mat_conv_ids,&local_228);
    this_local._4_4_ = spv::Function::getId(local_80);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_fp16_to_fp8(SPIRVModule &module, const spv::Id *ids, uint32_t id_count)
{
	if (id_count != 2)
		return 0;

	spv::Id u8_type = ids[0];
	spv::Id f16_type = ids[1];

	for (auto &ops : coop_mat_conv_ids)
		if (ops.output_type == u8_type && ops.input_type == f16_type && ops.call == HelperCall::CoopMatFP16toFP8)
			return ops.func_id;

	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();
	spv::Id s16_type = builder.makeIntType(16);

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id f16_ptr_type = builder.makePointer(spv::StorageClassFunction, f16_type);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, u8_type,
	                                       "CoopMatFP16toFP8",
	                                       { f16_ptr_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, u8_type, "coop_output");
	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(u8_type);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeFloatType(16)), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(builder.makeFloatType(16), spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		spv::Id glsl450 = builder.import("GLSL.std.450");
		auto *clamp = builder.addInstruction(builder.makeFloatType(16), spv::OpExtInst);
		clamp->addIdOperand(glsl450);
		clamp->addImmediateOperand(GLSLstd450NClamp);
		clamp->addIdOperand(load->getResultId());
		clamp->addIdOperand(builder.makeFloat16Constant(0x5f00 | 0x8000));
		clamp->addIdOperand(builder.makeFloat16Constant(0x5f00)); // 448.0.

		auto *bitcast = builder.addInstruction(s16_type, spv::OpBitcast);
		bitcast->addIdOperand(clamp->getResultId());

		// Extract the sign bit.
		auto *split_input = builder.addInstruction(builder.makeVectorType(builder.makeUintType(8), 2), spv::OpBitcast);
		split_input->addIdOperand(bitcast->getResultId());

		auto *extract_upper = builder.addInstruction(builder.makeUintType(8), spv::OpCompositeExtract);
		extract_upper->addIdOperand(split_input->getResultId());
		extract_upper->addImmediateOperand(1);

		auto *sign_bit = builder.addInstruction(builder.makeUintType(8), spv::OpBitwiseAnd);
		sign_bit->addIdOperand(extract_upper->getResultId());
		sign_bit->addIdOperand(builder.makeUint8Constant(0x80));
		///

		// When the input is shifted like this the result is E5M3 in upper byte, which is very handy.
		auto *unsigned_e5m11 = builder.addInstruction(s16_type, spv::OpShiftLeftLogical);
		unsigned_e5m11->addIdOperand(bitcast->getResultId());
		unsigned_e5m11->addIdOperand(builder.makeUint16Constant(1));

		// Shift -15 bias to -7 bias.
		auto *shift_exponent = builder.addInstruction(s16_type, spv::OpISub);
		shift_exponent->addIdOperand(unsigned_e5m11->getResultId());
		shift_exponent->addIdOperand(builder.makeInt16Constant(8 << 11));
		unsigned_e5m11 = shift_exponent;

		auto *exponent = builder.addInstruction(s16_type, spv::OpShiftRightArithmetic);
		exponent->addIdOperand(shift_exponent->getResultId());
		exponent->addIdOperand(builder.makeInt16Constant(11));

		auto *exponent_minus1 = builder.addInstruction(s16_type, spv::OpISub);
		exponent_minus1->addIdOperand(exponent->getResultId());
		exponent_minus1->addIdOperand(builder.makeInt16Constant(1));

		auto *denorm_shamt = builder.addInstruction(s16_type, spv::OpSNegate);
		denorm_shamt->addIdOperand(exponent_minus1->getResultId());

		// Ensure we don't get negative shift.
		clamp = builder.addInstruction(s16_type, spv::OpExtInst);
		clamp->addIdOperand(glsl450);
		clamp->addImmediateOperand(GLSLstd450SMax);
		clamp->addIdOperand(denorm_shamt->getResultId());
		clamp->addIdOperand(builder.makeInt16Constant(0));
		denorm_shamt = clamp;

		// If we're denorm, the arith shift ensures the upper bits are all 1.
		auto *denorm_mask = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
		denorm_mask->addIdOperand(exponent_minus1->getResultId());
		denorm_mask->addIdOperand(builder.makeInt16Constant(1 << 11));

		// Serves as a clamping function.
		// If the exponent goes negative here, we need to emit a 0 exponent, marking that we're in denorm region.
		auto *clear_exponent_neg_mask = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
		clear_exponent_neg_mask->addIdOperand(exponent_minus1->getResultId());
		clear_exponent_neg_mask->addIdOperand(builder.makeInt16Constant(int16_t(0x1f << 11)));
		auto *clear_exponent_mask = builder.addInstruction(s16_type, spv::OpBitwiseXor);
		clear_exponent_mask->addIdOperand(clear_exponent_neg_mask->getResultId());
		clear_exponent_mask->addIdOperand(builder.makeInt16Constant(-1));

		// Clamp negative exponent to 0.
		{
			auto *mask = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
			mask->addIdOperand(unsigned_e5m11->getResultId());
			mask->addIdOperand(clear_exponent_mask->getResultId());
			unsigned_e5m11 = mask;
		}

		// If denorm, add in the implicit 1.xxxx.
		{
			auto *mask = builder.addInstruction(s16_type, spv::OpBitwiseOr);
			mask->addIdOperand(unsigned_e5m11->getResultId());
			mask->addIdOperand(denorm_mask->getResultId());
			unsigned_e5m11 = mask;
		}

		// Before we shift, we need to capture any possible rounding bits.
		// Only capture the lower 7 bits.
		// If we shift more than 7 we've already exhausted all denorm bits on E4M3 anyway, so don't need to care.
		// Cannot capture the top bit in lower half since we might get a false positive for 0.5 condition.
		auto *pre_denorm_rounding_bits = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
		pre_denorm_rounding_bits->addIdOperand(unsigned_e5m11->getResultId());
		pre_denorm_rounding_bits->addIdOperand(builder.makeInt16Constant(0x7f));
		auto *trunc = builder.addInstruction(builder.makeIntType(8), spv::OpSConvert);
		trunc->addIdOperand(pre_denorm_rounding_bits->getResultId());
		pre_denorm_rounding_bits = trunc;

		// Now we apply the denorm shift.
		auto *denorm_shift = builder.addInstruction(s16_type, spv::OpShiftRightArithmetic);
		denorm_shift->addIdOperand(unsigned_e5m11->getResultId());
		denorm_shift->addIdOperand(denorm_shamt->getResultId());
		unsigned_e5m11 = denorm_shift;

		// Capture any rounding bits.
		// If we shift due to denorms,
		// we have to know if we shifted away bits that are relevant to RTE.
		auto *split = builder.addInstruction(builder.makeVectorType(builder.makeIntType(8), 2), spv::OpBitcast);
		split->addIdOperand(unsigned_e5m11->getResultId());

		auto *rounding_bits = builder.addInstruction(builder.makeIntType(8), spv::OpCompositeExtract);
		rounding_bits->addIdOperand(split->getResultId());
		rounding_bits->addImmediateOperand(0);

		auto *rounding_bits_or = builder.addInstruction(builder.makeIntType(8), spv::OpBitwiseOr);
		rounding_bits_or->addIdOperand(rounding_bits->getResultId());
		rounding_bits_or->addIdOperand(pre_denorm_rounding_bits->getResultId());
		rounding_bits = rounding_bits_or;

		auto *unsigned_e5m3 = builder.addInstruction(builder.makeIntType(8), spv::OpCompositeExtract);
		unsigned_e5m3->addIdOperand(split->getResultId());
		unsigned_e5m3->addImmediateOperand(1);

		auto *is_odd = builder.addInstruction(builder.makeIntType(8), spv::OpBitwiseAnd);
		is_odd->addIdOperand(unsigned_e5m3->getResultId());
		is_odd->addIdOperand(builder.makeInt8Constant(1));

		auto *or_rounding_bits = builder.addInstruction(builder.makeIntType(8), spv::OpBitwiseOr);
		or_rounding_bits->addIdOperand(is_odd->getResultId());
		or_rounding_bits->addIdOperand(rounding_bits->getResultId());

		// To get > 0x80 in lower bits either the fraction is > 0.5, or it's exactly 0.5 and the upper part is odd,
		// which would make the result 0x81.
		auto *should_round = builder.addInstruction(bool_type, spv::OpUGreaterThan);
		should_round->addIdOperand(or_rounding_bits->getResultId());
		should_round->addIdOperand(builder.makeUint8Constant(0x80));

		// Compensate for exponent bias when dealing with denorms.
		auto *rounding = builder.addInstruction(builder.makeUintType(8), spv::OpSelect);
		rounding->addIdOperand(should_round->getResultId());
		rounding->addIdOperand(builder.makeUint8Constant(1));
		rounding->addIdOperand(builder.makeUint8Constant(0));

		// Add rounding.
		auto *add_rounding = builder.addInstruction(builder.makeUintType(8), spv::OpIAdd);
		add_rounding->addIdOperand(unsigned_e5m3->getResultId());
		add_rounding->addIdOperand(rounding->getResultId());

		// Mask away the top exponent. We should be in range now anyway.
		auto *e4m3 = builder.addInstruction(builder.makeUintType(8), spv::OpBitwiseAnd);
		e4m3->addIdOperand(add_rounding->getResultId());
		e4m3->addIdOperand(builder.makeUint8Constant(0x7f));

		// OR in the sign bit.
		auto *with_sign = builder.addInstruction(builder.makeUintType(8), spv::OpBitwiseOr);
		with_sign->addIdOperand(e4m3->getResultId());
		with_sign->addIdOperand(sign_bit->getResultId());

		auto *output_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeUintType(8)), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());
		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(with_sign->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(u8_type, spv::OpLoad);
	loaded_result->addIdOperand(output_id);
	builder.makeReturn(false, loaded_result->getResultId());
	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ f16_type, u8_type, func->getId(), HelperCall::CoopMatFP16toFP8 });
	return func->getId();
}